

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void print_moves(vector<Card,_std::allocator<Card>_> *cards)

{
  ostream *poVar1;
  pointer this;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Printing moves....",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  this = (cards->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.super__Vector_impl_data.
         _M_start;
  if (this != (cards->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
              super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Card is ",8);
      Card::Card2Str_abi_cxx11_(&local_50,this);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      this = this + 1;
    } while (this != (cards->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"....",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  return;
}

Assistant:

void print_moves(std::vector<Card> cards)
{
    std::cout << "Printing moves...." << std::endl;
    for(std::vector<Card>::iterator it = cards.begin(); it != cards.end(); ++it) {
        std::cout << "Card is " << it->Card2Str() << std::endl;
    }
    std::cout << "...." << std::endl;
}